

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImStrdup(char *str)

{
  int *piVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  
  sVar2 = strlen(str);
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  __dest = (*GImAllocatorAllocFunc)(sVar2 + 1,GImAllocatorUserData);
  pcVar3 = (char *)memcpy(__dest,str,sVar2 + 1);
  return pcVar3;
}

Assistant:

char* ImStrdup(const char* str)
{
    size_t len = strlen(str);
    void* buf = ImGui::MemAlloc(len + 1);
    return (char*)memcpy(buf, (const void*)str, len + 1);
}